

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O1

OperatorResultType __thiscall
duckdb::PipelineExecutor::Execute
          (PipelineExecutor *this,DataChunk *input,DataChunk *result,idx_t initial_idx)

{
  PhysicalOperator *op;
  bool bVar1;
  idx_t iVar2;
  OperatorResultType OVar3;
  uint uVar4;
  int operator_idx;
  reference pvVar5;
  DataChunk *pDVar6;
  reference pvVar7;
  type pGVar8;
  reference this_00;
  type pOVar9;
  undefined8 extraout_RAX;
  _Elt_pointer puVar10;
  InterruptException *this_01;
  PhysicalOperator *op_00;
  ulong uVar11;
  idx_t current_idx;
  idx_t local_88;
  undefined4 local_7c;
  deque<unsigned_long,std::allocator<unsigned_long>> *local_78;
  ulong local_70;
  DataChunk *local_68;
  DataChunk *local_60;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_58;
  PhysicalOperator *local_50;
  long local_48;
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
  *local_40;
  ulong local_38;
  
  if (input->count != 0) {
    local_78 = (deque<unsigned_long,std::allocator<unsigned_long>> *)&this->in_process_operators;
    puVar10 = (this->in_process_operators).c.
              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    local_88 = initial_idx;
    local_60 = input;
    if (puVar10 !=
        (this->in_process_operators).c.
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (puVar10 ==
          (this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        puVar10 = (this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_88 = puVar10[-1];
      ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    }
    if (local_88 == initial_idx) {
      local_88 = local_88 + 1;
    }
    iVar2 = local_88;
    if (local_88 <=
        (ulong)((long)(this->pipeline->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->pipeline->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      if (((((this->context).client)->interrupted)._M_base._M_i & 1U) != 0) {
        this_01 = (InterruptException *)__cxa_allocate_exception(0x10);
        InterruptException::InterruptException(this_01);
        __cxa_throw(this_01,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50 = (PhysicalOperator *)&this->context;
      local_58 = &this->intermediate_chunks;
      local_38 = initial_idx + 1;
      local_40 = &this->intermediate_states;
      local_48 = 2;
      local_7c = 2;
      local_70 = initial_idx;
      local_68 = result;
      if (local_88 <
          (ulong)((long)(this->intermediate_chunks).
                        super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->intermediate_chunks).
                        super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                 ::operator[](local_58,local_88);
        result = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*(pvVar5);
      }
      DataChunk::Reset(result);
      uVar4 = 1;
      if (local_88 == initial_idx) {
        local_7c = 0;
      }
      else {
        pDVar6 = local_60;
        if (iVar2 != local_38) {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                   ::operator[](local_58,iVar2 - 1);
          pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                   operator*(pvVar5);
        }
        pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                           (&this->pipeline->operators,local_88 - 1);
        op = pvVar7->_M_data;
        StartOperator(this,op);
        pGVar8 = unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
                 ::operator*(&op->op_state);
        this_00 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                  ::operator[](local_40,iVar2 - 1);
        pOVar9 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                 ::operator*(this_00);
        op_00 = local_50;
        uVar4 = (*op->_vptr_PhysicalOperator[10])(op,local_50,pDVar6,result,pGVar8,pOVar9);
        EndOperator(this,op_00,(optional_ptr<duckdb::DataChunk,_true>)result);
        uVar11 = local_70;
        if ((char)uVar4 == '\x02') {
          operator_idx = NumericCastImpl<int,_unsigned_long,_false>::Convert(local_88);
          FinishProcessing(this,operator_idx);
          local_7c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
          bVar1 = false;
          uVar11 = local_70;
        }
        else {
          if ((uVar4 & 0xff) == 1) {
            puVar10 = (this->in_process_operators).c.
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (puVar10 ==
                (this->in_process_operators).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
              _M_push_back_aux<unsigned_long_const&>(local_78,&local_88);
            }
            else {
              *puVar10 = local_88;
              (this->in_process_operators).c.
              super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar10 + 1;
            }
          }
          DataChunk::Verify(result);
          bVar1 = true;
        }
        if (bVar1) {
          if (result->count == 0) {
            if (local_88 == uVar11) {
              uVar4 = 3;
            }
            else {
              puVar10 = (this->in_process_operators).c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (puVar10 !=
                  (this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
                if (puVar10 ==
                    (this->in_process_operators).c.
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  puVar10 = (this->in_process_operators).c.
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                            .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                local_88 = puVar10[-1];
                ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                          ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
                OVar3 = (*(code *)(&DAT_01e18530 + *(int *)(&DAT_01e18530 + local_48 * 4)))();
                return OVar3;
              }
              uVar4 = 2;
              local_88 = uVar11;
            }
          }
          else {
            uVar4 = (uint)((ulong)((long)(this->pipeline->operators).
                                         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                         .
                                         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->pipeline->operators).
                                         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                         .
                                         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) <
                          local_88 + 1) * 3;
            local_88 = local_88 + 1;
          }
        }
        else {
          uVar4 = 1;
        }
      }
      OVar3 = (*(code *)(&DAT_01e18530 + *(int *)(&DAT_01e18530 + (ulong)uVar4 * 4)))();
      return OVar3;
    }
    DataChunk::Reference(result,local_60);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PipelineExecutor::Execute(DataChunk &input, DataChunk &result, idx_t initial_idx) {
	if (input.size() == 0) { // LCOV_EXCL_START
		return OperatorResultType::NEED_MORE_INPUT;
	} // LCOV_EXCL_STOP
	D_ASSERT(!pipeline.operators.empty());

	idx_t current_idx;
	GoToSource(current_idx, initial_idx);
	if (current_idx == initial_idx) {
		current_idx++;
	}
	if (current_idx > pipeline.operators.size()) {
		result.Reference(input);
		return OperatorResultType::NEED_MORE_INPUT;
	}
	while (true) {
		if (context.client.interrupted) {
			throw InterruptException();
		}
		// now figure out where to put the chunk
		// if current_idx is the last possible index (>= operators.size()) we write to the result
		// otherwise we write to an intermediate chunk
		auto current_intermediate = current_idx;
		auto &current_chunk =
		    current_intermediate >= intermediate_chunks.size() ? result : *intermediate_chunks[current_intermediate];
		current_chunk.Reset();
		if (current_idx == initial_idx) {
			// we went back to the source: we need more input
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			auto &prev_chunk =
			    current_intermediate == initial_idx + 1 ? input : *intermediate_chunks[current_intermediate - 1];
			auto operator_idx = current_idx - 1;
			auto &current_operator = pipeline.operators[operator_idx].get();

			// if current_idx > source_idx, we pass the previous operators' output through the Execute of the current
			// operator
			StartOperator(current_operator);
			auto result = current_operator.Execute(context, prev_chunk, current_chunk, *current_operator.op_state,
			                                       *intermediate_states[current_intermediate - 1]);
			EndOperator(current_operator, &current_chunk);
			if (result == OperatorResultType::HAVE_MORE_OUTPUT) {
				// more data remains in this operator
				// push in-process marker
				in_process_operators.push(current_idx);
			} else if (result == OperatorResultType::FINISHED) {
				D_ASSERT(current_chunk.size() == 0);
				FinishProcessing(NumericCast<int32_t>(current_idx));
				return OperatorResultType::FINISHED;
			}
			current_chunk.Verify();
		}

		if (current_chunk.size() == 0) {
			// no output from this operator!
			if (current_idx == initial_idx) {
				// if we got no output from the scan, we are done
				break;
			} else {
				// if we got no output from an intermediate op
				// we go back and try to pull data from the source again
				GoToSource(current_idx, initial_idx);
				continue;
			}
		} else {
			// we got output! continue to the next operator
			current_idx++;
			if (current_idx > pipeline.operators.size()) {
				// if we got output and are at the last operator, we are finished executing for this output chunk
				// return the data and push it into the chunk
				break;
			}
		}
	}
	return in_process_operators.empty() ? OperatorResultType::NEED_MORE_INPUT : OperatorResultType::HAVE_MORE_OUTPUT;
}